

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::ToPrimitiveImpl<376>
          (DynamicObject *this,Var *result,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  TypeId TVar4;
  DynamicObject *pDVar5;
  DynamicObject *pDVar6;
  InlineCache *inlineCache_00;
  JavascriptLibrary *pJVar7;
  JavascriptFunction *pJVar8;
  undefined4 *puVar9;
  Var pvVar10;
  InlineCache *inlineCache;
  Var aValue;
  ScriptContext *requestContext_local;
  Var *result_local;
  DynamicObject *this_local;
  
  inlineCache = (InlineCache *)0x0;
  bVar2 = Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
                    (&this->super_RecyclableObject);
  if (bVar2) {
    pDVar5 = (DynamicObject *)RecyclableObject::GetPrototype(&this->super_RecyclableObject);
    pJVar7 = ScriptContext::GetLibrary(requestContext);
    pDVar6 = JavascriptLibraryBase::GetObjectPrototype(&pJVar7->super_JavascriptLibraryBase);
    if ((pDVar5 == pDVar6) &&
       (iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])(), iVar3 == 0)) {
      pJVar7 = ScriptContext::GetLibrary(requestContext);
      pDVar5 = JavascriptLibraryBase::GetObjectPrototype(&pJVar7->super_JavascriptLibraryBase);
      iVar3 = (*(pDVar5->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
      if (iVar3 == 0) {
        pJVar7 = ScriptContext::GetLibrary(requestContext);
        inlineCache = (InlineCache *)JavascriptLibrary::GetObjectToStringFunction(pJVar7);
      }
    }
  }
  if (inlineCache == (InlineCache *)0x0) {
    inlineCache_00 = ScriptContext::GetToStringInlineCache(requestContext);
    inlineCache = (InlineCache *)
                  Js::JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache
                            (inlineCache_00,this,&this->super_RecyclableObject,0x178,requestContext)
    ;
  }
  pJVar7 = ScriptContext::GetLibrary(requestContext);
  pJVar8 = JavascriptLibrary::GetObjectToStringFunction(pJVar7);
  if ((JavascriptFunction *)inlineCache == pJVar8) {
    bVar2 = JavascriptConversion::IsCallable(inlineCache);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1b9,"(JavascriptConversion::IsCallable(aValue))",
                                  "JavascriptConversion::IsCallable(aValue)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    TVar4 = RecyclableObject::GetTypeId(&this->super_RecyclableObject);
    if ((TVar4 == TypeIds_HostDispatch) ||
       (TVar4 = RecyclableObject::GetTypeId(&this->super_RecyclableObject),
       TVar4 == TypeIds_HostObject)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1bd,
                                  "(this->GetTypeId() != TypeIds_HostDispatch && this->GetTypeId() != TypeIds_HostObject)"
                                  ,
                                  "this->GetTypeId() != TypeIds_HostDispatch && this->GetTypeId() != TypeIds_HostObject"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pvVar10 = JavascriptObject::ToStringHelper(this,requestContext);
    *result = pvVar10;
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = CallToPrimitiveFunction(this,inlineCache,0x178,result,requestContext);
  }
  return this_local._4_4_;
}

Assistant:

BOOL DynamicObject::ToPrimitiveImpl(Var* result, ScriptContext * requestContext)
    {
        CompileAssert(propertyId == PropertyIds::valueOf || propertyId == PropertyIds::toString);
        Var aValue = nullptr;
        if (JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(this))
        {
            if (this->GetPrototype() == requestContext->GetLibrary()->GetObjectPrototype() &&
                !this->IsCrossSiteObject() &&
                !requestContext->GetLibrary()->GetObjectPrototype()->IsCrossSiteObject())
            {
                aValue = (propertyId == PropertyIds::valueOf)
                    ? requestContext->GetLibrary()->GetObjectValueOfFunction()
                    : requestContext->GetLibrary()->GetObjectToStringFunction();
            }
        }
        if(!aValue)
        {
            InlineCache * inlineCache = propertyId == PropertyIds::valueOf ? requestContext->GetValueOfInlineCache() : requestContext->GetToStringInlineCache();
            // Use per script context inline cache for valueOf and toString
            aValue = JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache(inlineCache, this, this, propertyId, requestContext);
        }

        // Fast path to the default valueOf/toString implementation
        if (propertyId == PropertyIds::valueOf)
        {
            if (aValue == requestContext->GetLibrary()->GetObjectValueOfFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // The default Object.prototype.valueOf will in turn just call ToObject().
                // The result is always an object if it is not undefined or null (which "this" is not)
                return false;
            }
        }
        else
        {
            if (aValue == requestContext->GetLibrary()->GetObjectToStringFunction())
            {
                Assert(JavascriptConversion::IsCallable(aValue));
                // These typeIds should never be here (they override ToPrimitive or they don't derive to DynamicObject::ToPrimitive)
                // Otherwise, they may case implicit call in ToStringHelper
                Assert(this->GetTypeId() != TypeIds_HostDispatch
                    && this->GetTypeId() != TypeIds_HostObject);
                *result = JavascriptObject::ToStringHelper(this, requestContext);
                return true;
            }
        }

        return CallToPrimitiveFunction(aValue, propertyId, result, requestContext);
    }